

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_75e5::test_art_iterator_lower_bound(void **param_1)

{
  initializer_list<const_char_*> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<const_char_*> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<const_char_*> __l_03;
  initializer_list<unsigned_long> __l_04;
  ulong uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  size_type sVar10;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar11;
  reference ppcVar12;
  art_t *paVar13;
  char *key3;
  char *key2_1;
  art_iterator_t iterator_4;
  art_t art_4;
  art_val_t value;
  char *key1_1;
  char *key_4;
  char *key_3;
  char *key_2;
  char *key_1;
  art_iterator_t iterator_3;
  size_t i_2;
  art_t art_3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values_2;
  vector<const_char_*,_std::allocator<const_char_*>_> keys_2;
  char *key2;
  char *key1;
  art_iterator_t iterator_2;
  size_t i_1;
  art_t art_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values_1;
  vector<const_char_*,_std::allocator<const_char_*>_> keys_1;
  char *key;
  art_iterator_t iterator_1;
  size_t i;
  art_t art_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  art_iterator_t iterator;
  art_t art;
  undefined1 in_stack_fffffffffffff718;
  undefined1 in_stack_fffffffffffff719;
  undefined1 in_stack_fffffffffffff71a;
  undefined1 in_stack_fffffffffffff71b;
  undefined1 in_stack_fffffffffffff71c;
  undefined1 in_stack_fffffffffffff71d;
  undefined1 in_stack_fffffffffffff71e;
  undefined1 in_stack_fffffffffffff71f;
  art_t *in_stack_fffffffffffff720;
  art_t *in_stack_fffffffffffff728;
  art_t *art_00;
  art_t *in_stack_fffffffffffff730;
  art_t *art_01;
  art_iterator_t *in_stack_fffffffffffff738;
  art_iterator_t *iterator_00;
  allocator_type *in_stack_fffffffffffff748;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffff750;
  vector<const_char_*,_std::allocator<const_char_*>_> *this;
  iterator in_stack_fffffffffffff758;
  iterator ppcVar14;
  size_type in_stack_fffffffffffff760;
  undefined1 *puVar15;
  art_t *local_660;
  undefined1 local_5b9 [80];
  undefined1 local_569;
  char *local_568;
  char *pcStack_560;
  char *local_558;
  char **local_548;
  undefined1 local_540 [32];
  char *local_520;
  char *local_518;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_480;
  undefined1 local_3d9;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b8;
  undefined8 local_3b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3a8;
  undefined1 local_389;
  char *local_388;
  char *pcStack_380;
  char *local_378;
  char *pcStack_370;
  char **local_360;
  undefined8 local_358;
  vector<const_char_*,_std::allocator<const_char_*>_> local_350;
  char *local_338;
  ulong local_2a0;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 *local_1c8;
  undefined8 local_1c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1b8 [2];
  char *local_188;
  char *pcStack_180;
  char *local_178;
  char *pcStack_170;
  char *local_168;
  char **local_158;
  undefined8 local_150;
  vector<const_char_*,_std::allocator<const_char_*>_> local_148 [13];
  
  art_init_cleared((art_t *)in_stack_fffffffffffff720);
  art_init_iterator(in_stack_fffffffffffff730,SUB81((ulong)in_stack_fffffffffffff728 >> 0x38,0));
  _assert_true((unsigned_long)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
               (char *)in_stack_fffffffffffff720,
               CONCAT13(in_stack_fffffffffffff71f,
                        CONCAT12(in_stack_fffffffffffff71e,
                                 CONCAT11(in_stack_fffffffffffff71d,in_stack_fffffffffffff71c))));
  art_iterator_lower_bound(in_stack_fffffffffffff738,(art_key_chunk_t *)in_stack_fffffffffffff730);
  _assert_true((unsigned_long)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
               (char *)in_stack_fffffffffffff720,
               CONCAT13(in_stack_fffffffffffff71f,
                        CONCAT12(in_stack_fffffffffffff71e,
                                 CONCAT11(in_stack_fffffffffffff71d,in_stack_fffffffffffff71c))));
  art_iterator_lower_bound(in_stack_fffffffffffff738,(art_key_chunk_t *)in_stack_fffffffffffff730);
  _assert_true((unsigned_long)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
               (char *)in_stack_fffffffffffff720,
               CONCAT13(in_stack_fffffffffffff71f,
                        CONCAT12(in_stack_fffffffffffff71e,
                                 CONCAT11(in_stack_fffffffffffff71d,in_stack_fffffffffffff71c))));
  art_free((art_t *)in_stack_fffffffffffff720);
  local_168 = "001005";
  local_178 = "000003";
  pcStack_170 = "000004";
  local_188 = "000001";
  pcStack_180 = "000002";
  local_158 = &local_188;
  local_150 = 5;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x103f9a);
  __l._M_len = in_stack_fffffffffffff760;
  __l._M_array = in_stack_fffffffffffff758;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (in_stack_fffffffffffff750,__l,(allocator_type *)in_stack_fffffffffffff748);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x103fce);
  local_1e8 = 3;
  uStack_1e0 = 4;
  local_1f8 = 1;
  uStack_1f0 = 2;
  local_1d8 = 5;
  local_1c8 = &local_1f8;
  local_1c0 = 5;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x104026);
  __l_00._M_len = in_stack_fffffffffffff760;
  __l_00._M_array = (iterator)in_stack_fffffffffffff758;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff750,
             __l_00,in_stack_fffffffffffff748);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x104057);
  art_init_cleared((art_t *)in_stack_fffffffffffff720);
  local_2a0 = 0;
  while( true ) {
    uVar1 = local_2a0;
    sVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(local_148);
    if (sVar10 <= uVar1) break;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](local_148,local_2a0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_1b8,local_2a0);
    art_insert(in_stack_fffffffffffff728,(art_key_chunk_t *)in_stack_fffffffffffff720,
               CONCAT17(in_stack_fffffffffffff71f,
                        CONCAT16(in_stack_fffffffffffff71e,
                                 CONCAT15(in_stack_fffffffffffff71d,
                                          CONCAT14(in_stack_fffffffffffff71c,
                                                   CONCAT13(in_stack_fffffffffffff71b,
                                                            CONCAT12(in_stack_fffffffffffff71a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff719,
                                                  in_stack_fffffffffffff718))))))));
    assert_art_valid(in_stack_fffffffffffff720);
    local_2a0 = local_2a0 + 1;
  }
  art_init_iterator(in_stack_fffffffffffff730,SUB81((ulong)in_stack_fffffffffffff728 >> 0x38,0));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](local_148,2);
  art_iterator_lower_bound(in_stack_fffffffffffff738,(art_key_chunk_t *)in_stack_fffffffffffff730);
  _assert_true((unsigned_long)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
               (char *)in_stack_fffffffffffff720,
               CONCAT13(in_stack_fffffffffffff71f,
                        CONCAT12(in_stack_fffffffffffff71e,
                                 CONCAT11(in_stack_fffffffffffff71d,in_stack_fffffffffffff71c))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](local_148,2);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffff720,
                (art_key_chunk_t *)
                CONCAT17(in_stack_fffffffffffff71f,
                         CONCAT16(in_stack_fffffffffffff71e,
                                  CONCAT15(in_stack_fffffffffffff71d,
                                           CONCAT14(in_stack_fffffffffffff71c,
                                                    CONCAT13(in_stack_fffffffffffff71b,
                                                             CONCAT12(in_stack_fffffffffffff71a,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffff719,
                                                  in_stack_fffffffffffff718))))))));
  local_338 = "000005";
  art_iterator_lower_bound(in_stack_fffffffffffff738,(art_key_chunk_t *)in_stack_fffffffffffff730);
  _assert_true((unsigned_long)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
               (char *)in_stack_fffffffffffff720,
               CONCAT13(in_stack_fffffffffffff71f,
                        CONCAT12(in_stack_fffffffffffff71e,
                                 CONCAT11(in_stack_fffffffffffff71d,in_stack_fffffffffffff71c))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](local_148,4);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffff720,
                (art_key_chunk_t *)
                CONCAT17(in_stack_fffffffffffff71f,
                         CONCAT16(in_stack_fffffffffffff71e,
                                  CONCAT15(in_stack_fffffffffffff71d,
                                           CONCAT14(in_stack_fffffffffffff71c,
                                                    CONCAT13(in_stack_fffffffffffff71b,
                                                             CONCAT12(in_stack_fffffffffffff71a,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffff719,
                                                  in_stack_fffffffffffff718))))))));
  art_free((art_t *)in_stack_fffffffffffff720);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff730);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffff730);
  local_378 = "000004";
  pcStack_370 = "001005";
  local_388 = "000001";
  pcStack_380 = "000003";
  local_360 = &local_388;
  local_358 = 4;
  puVar15 = &local_389;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x1042f9);
  __l_01._M_len = (size_type)puVar15;
  __l_01._M_array = in_stack_fffffffffffff758;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (in_stack_fffffffffffff750,__l_01,(allocator_type *)in_stack_fffffffffffff748);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x10432a);
  local_3c8 = 4;
  uStack_3c0 = 5;
  local_3d8 = 1;
  uStack_3d0 = 3;
  local_3b8 = &local_3d8;
  local_3b0 = 4;
  ppcVar14 = (iterator)&local_3d9;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x104376);
  __l_02._M_len = (size_type)puVar15;
  __l_02._M_array = (iterator)ppcVar14;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff750,
             __l_02,in_stack_fffffffffffff748);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1043a7);
  art_init_cleared((art_t *)in_stack_fffffffffffff720);
  local_480 = (vector<const_char_*,_std::allocator<const_char_*>_> *)0x0;
  while( true ) {
    this = local_480;
    pvVar11 = (vector<const_char_*,_std::allocator<const_char_*>_> *)
              std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_350);
    if (pvVar11 <= this) break;
    ppcVar12 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                         (&local_350,(size_type)local_480);
    in_stack_fffffffffffff748 = (allocator_type *)*ppcVar12;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              (&local_3a8,(size_type)local_480);
    art_insert(in_stack_fffffffffffff728,(art_key_chunk_t *)in_stack_fffffffffffff720,
               CONCAT17(in_stack_fffffffffffff71f,
                        CONCAT16(in_stack_fffffffffffff71e,
                                 CONCAT15(in_stack_fffffffffffff71d,
                                          CONCAT14(in_stack_fffffffffffff71c,
                                                   CONCAT13(in_stack_fffffffffffff71b,
                                                            CONCAT12(in_stack_fffffffffffff71a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff719,
                                                  in_stack_fffffffffffff718))))))));
    assert_art_valid(in_stack_fffffffffffff720);
    local_480 = (vector<const_char_*,_std::allocator<const_char_*>_> *)
                ((long)&(local_480->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                        ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  art_init_iterator(in_stack_fffffffffffff730,SUB81((ulong)in_stack_fffffffffffff728 >> 0x38,0));
  local_518 = "000002";
  art_iterator_lower_bound(in_stack_fffffffffffff738,(art_key_chunk_t *)in_stack_fffffffffffff730);
  _assert_true((unsigned_long)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
               (char *)in_stack_fffffffffffff720,
               CONCAT13(in_stack_fffffffffffff71f,
                        CONCAT12(in_stack_fffffffffffff71e,
                                 CONCAT11(in_stack_fffffffffffff71d,in_stack_fffffffffffff71c))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_350,1);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffff720,
                (art_key_chunk_t *)
                CONCAT17(in_stack_fffffffffffff71f,
                         CONCAT16(in_stack_fffffffffffff71e,
                                  CONCAT15(in_stack_fffffffffffff71d,
                                           CONCAT14(in_stack_fffffffffffff71c,
                                                    CONCAT13(in_stack_fffffffffffff71b,
                                                             CONCAT12(in_stack_fffffffffffff71a,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffff719,
                                                  in_stack_fffffffffffff718))))))));
  local_520 = "000001";
  art_iterator_lower_bound(in_stack_fffffffffffff738,(art_key_chunk_t *)in_stack_fffffffffffff730);
  _assert_true((unsigned_long)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
               (char *)in_stack_fffffffffffff720,
               CONCAT13(in_stack_fffffffffffff71f,
                        CONCAT12(in_stack_fffffffffffff71e,
                                 CONCAT11(in_stack_fffffffffffff71d,in_stack_fffffffffffff71c))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_350,0);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffff720,
                (art_key_chunk_t *)
                CONCAT17(in_stack_fffffffffffff71f,
                         CONCAT16(in_stack_fffffffffffff71e,
                                  CONCAT15(in_stack_fffffffffffff71d,
                                           CONCAT14(in_stack_fffffffffffff71c,
                                                    CONCAT13(in_stack_fffffffffffff71b,
                                                             CONCAT12(in_stack_fffffffffffff71a,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffff719,
                                                  in_stack_fffffffffffff718))))))));
  art_free((art_t *)in_stack_fffffffffffff720);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff730);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffff730);
  local_558 = "000300";
  local_568 = "000100";
  pcStack_560 = "000200";
  local_548 = &local_568;
  local_540._0_8_ = 3;
  iterator_00 = (art_iterator_t *)&local_569;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x10465c);
  __l_03._M_len = (size_type)puVar15;
  __l_03._M_array = ppcVar14;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (this,__l_03,(allocator_type *)in_stack_fffffffffffff748);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x10468d);
  local_5b9._1_8_ = 1;
  local_5b9._9_8_ = 2;
  local_5b9._17_8_ = 3;
  local_5b9._33_8_ = local_5b9 + 1;
  local_5b9._41_8_ = 3;
  art_01 = (art_t *)local_5b9;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1046d6);
  __l_04._M_len = (size_type)puVar15;
  __l_04._M_array = (iterator)ppcVar14;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,__l_04,
             in_stack_fffffffffffff748);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x104707);
  art_init_cleared((art_t *)in_stack_fffffffffffff720);
  local_660 = (art_t *)0x0;
  while( true ) {
    art_00 = local_660;
    paVar13 = (art_t *)std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                 ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                  (local_540 + 8));
    if (paVar13 <= art_00) break;
    ppcVar12 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_540 + 8),
                          (size_type)local_660);
    in_stack_fffffffffffff720 = (art_t *)*ppcVar12;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_5b9 + 0x31),
               (size_type)local_660);
    art_insert(art_00,(art_key_chunk_t *)in_stack_fffffffffffff720,
               CONCAT17(in_stack_fffffffffffff71f,
                        CONCAT16(in_stack_fffffffffffff71e,
                                 CONCAT15(in_stack_fffffffffffff71d,
                                          CONCAT14(in_stack_fffffffffffff71c,
                                                   CONCAT13(in_stack_fffffffffffff71b,
                                                            CONCAT12(in_stack_fffffffffffff71a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff719,
                                                  in_stack_fffffffffffff718))))))));
    assert_art_valid(in_stack_fffffffffffff720);
    local_660 = (art_t *)((long)&local_660->root + 1);
  }
  art_init_iterator(art_01,SUB81((ulong)art_00 >> 0x38,0));
  uVar2 = art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)art_01);
  _assert_true((unsigned_long)art_01,(char *)art_00,(char *)in_stack_fffffffffffff720,
               CONCAT13(uVar2,CONCAT12(in_stack_fffffffffffff71e,
                                       CONCAT11(in_stack_fffffffffffff71d,in_stack_fffffffffffff71c)
                                      )));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_540 + 8),2);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffff720,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff71e,
                                        CONCAT15(in_stack_fffffffffffff71d,
                                                 CONCAT14(in_stack_fffffffffffff71c,
                                                          CONCAT13(in_stack_fffffffffffff71b,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffff71a,
                                                  CONCAT11(in_stack_fffffffffffff719,
                                                           in_stack_fffffffffffff718))))))));
  uVar3 = art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)art_01);
  _assert_true((unsigned_long)art_01,(char *)art_00,(char *)in_stack_fffffffffffff720,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(in_stack_fffffffffffff71d,
                                                      in_stack_fffffffffffff71c))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_540 + 8),0);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffff720,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff71d,
                                                       CONCAT14(in_stack_fffffffffffff71c,
                                                                CONCAT13(in_stack_fffffffffffff71b,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffff71a,
                                                  CONCAT11(in_stack_fffffffffffff719,
                                                           in_stack_fffffffffffff718))))))));
  uVar4 = art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)art_01);
  _assert_true((unsigned_long)art_01,(char *)art_00,(char *)in_stack_fffffffffffff720,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,in_stack_fffffffffffff71c))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_540 + 8),2);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffff720,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffff71c,
                                                                      CONCAT13(
                                                  in_stack_fffffffffffff71b,
                                                  CONCAT12(in_stack_fffffffffffff71a,
                                                           CONCAT11(in_stack_fffffffffffff719,
                                                                    in_stack_fffffffffffff718)))))))
               );
  uVar5 = art_iterator_next((art_iterator_t *)0x1049c8);
  _assert_true((unsigned_long)art_01,(char *)art_00,(char *)in_stack_fffffffffffff720,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  uVar6 = art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)art_01);
  _assert_true((unsigned_long)art_01,(char *)art_00,(char *)in_stack_fffffffffffff720,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_540 + 8),2);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffff720,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  in_stack_fffffffffffff71a,
                                                  CONCAT11(in_stack_fffffffffffff719,
                                                           in_stack_fffffffffffff718))))))));
  uVar7 = art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)art_01);
  _assert_true((unsigned_long)art_01,(char *)art_00,(char *)in_stack_fffffffffffff720,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_540 + 8),0);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffff720,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(in_stack_fffffffffffff719,
                                                                 in_stack_fffffffffffff718))))))));
  uVar8 = art_iterator_prev((art_iterator_t *)0x104adb);
  _assert_true((unsigned_long)art_01,(char *)art_00,(char *)in_stack_fffffffffffff720,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  uVar9 = art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)art_01);
  _assert_true((unsigned_long)art_01,(char *)art_00,(char *)in_stack_fffffffffffff720,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_540 + 8),0);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffff720,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
  art_free((art_t *)in_stack_fffffffffffff720);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)art_01);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)art_01);
  art_init_cleared((art_t *)in_stack_fffffffffffff720);
  art_insert(art_00,(art_key_chunk_t *)in_stack_fffffffffffff720,
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
  art_init_iterator(art_01,SUB81((ulong)art_00 >> 0x38,0));
  art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)art_01);
  _assert_true((unsigned_long)art_01,(char *)art_00,(char *)in_stack_fffffffffffff720,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffff720,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
  art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)art_01);
  _assert_true((unsigned_long)art_01,(char *)art_00,(char *)in_stack_fffffffffffff720,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffff720,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
  art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)art_01);
  _assert_true((unsigned_long)art_01,(char *)art_00,(char *)in_stack_fffffffffffff720,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  art_free((art_t *)in_stack_fffffffffffff720);
  return;
}

Assistant:

DEFINE_TEST(test_art_iterator_lower_bound) {
    {
        art_t art;
        art_init_cleared(&art);
        art_iterator_t iterator = art_init_iterator(&art, true);
        assert_null(iterator.value);
        assert_false(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)"000000"));
        assert_false(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)"000001"));
        art_free(&art);
    }
    {
        std::vector<const char*> keys = {
            "000001", "000002", "000003", "000004", "001005",
        };
        std::vector<art_val_t> values = {1, 2, 3, 4, 5};
        art_t art;
        art_init_cleared(&art);
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], values[i]);
            assert_art_valid(&art);
        }

        art_iterator_t iterator = art_init_iterator(&art, true);
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)keys[2]));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        const char* key = "000005";
        assert_true(art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[4]);
        art_free(&art);
    }
    {
        // Lower bound search within a node's children.
        std::vector<const char*> keys = {"000001", "000003", "000004",
                                         "001005"};
        std::vector<art_val_t> values = {1, 3, 4, 5};
        art_t art;
        art_init_cleared(&art);
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], values[i]);
            assert_art_valid(&art);
        }
        art_iterator_t iterator = art_init_iterator(&art, true);

        const char* key1 = "000002";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[1]);

        // Check that we can go backward within a node's children.
        const char* key2 = "000001";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);

        art_free(&art);
    }
    {
        // Lower bound search with leaf where prefix is equal but full key is
        // smaller.
        std::vector<const char*> keys = {"000100", "000200", "000300"};
        std::vector<art_val_t> values = {1, 2, 3};
        art_t art;
        art_init_cleared(&art);
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], values[i]);
            assert_art_valid(&art);
        }
        art_iterator_t iterator = art_init_iterator(&art, true);

        {
            const char* key = "000201";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        }
        {
            // Check that we can go backward.
            const char* key = "000099";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
        }
        {
            // Check that we can go backward from after the end.
            const char* key = "000300";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
            assert_false(art_iterator_next(&iterator));
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        }
        {
            // Check that we can go forward from before the start.
            const char* key = "000100";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
            assert_false(art_iterator_prev(&iterator));
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
        }

        art_free(&art);
    }
    {
        // Lower bound search with only a single leaf.
        const char* key1 = "000001";
        art_val_t value{1};
        art_t art;
        art_init_cleared(&art);
        art_insert(&art, (art_key_chunk_t*)key1, value);

        art_iterator_t iterator = art_init_iterator(&art, true);

        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1));
        assert_key_eq(iterator.key, (art_key_chunk_t*)key1);

        const char* key2 = "000000";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2));
        assert_key_eq(iterator.key, (art_key_chunk_t*)key1);

        const char* key3 = "000002";
        assert_false(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key3));

        art_free(&art);
    }
}